

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3CodeVerifySchema(Parse *pParse,int iDb)

{
  sqlite3 *db;
  int iVar1;
  Parse *pParse_00;
  Btree *pBStack_20;
  
  pParse_00 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pParse_00 = pParse;
  }
  if (((pParse_00->cookieMask >> (iDb & 0x1fU) & 1) == 0) &&
     (pParse_00->cookieMask = pParse_00->cookieMask | 1 << ((byte)iDb & 0x1f), iDb == 1)) {
    db = pParse_00->db;
    if ((db->aDb[1].pBt == (Btree *)0x0) && (pParse_00->explain == '\0')) {
      iVar1 = sqlite3BtreeOpen(db->pVfs,(char *)0x0,db,&pBStack_20,0,0x21e);
      if (iVar1 == 0) {
        db->aDb[1].pBt = pBStack_20;
        iVar1 = sqlite3BtreeSetPageSize(pBStack_20,db->nextPagesize,-1,0);
        if (iVar1 == 7) {
          sqlite3OomFault(db);
        }
      }
      else {
        sqlite3ErrorMsg(pParse_00,
                        "unable to open a temporary database file for storing temporary tables");
        pParse_00->rc = iVar1;
      }
    }
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeVerifySchema(Parse *pParse, int iDb){
  Parse *pToplevel = sqlite3ParseToplevel(pParse);

  assert( iDb>=0 && iDb<pParse->db->nDb );
  assert( pParse->db->aDb[iDb].pBt!=0 || iDb==1 );
  assert( iDb<SQLITE_MAX_ATTACHED+2 );
  assert( sqlite3SchemaMutexHeld(pParse->db, iDb, 0) );
  if( DbMaskTest(pToplevel->cookieMask, iDb)==0 ){
    DbMaskSet(pToplevel->cookieMask, iDb);
    if( !OMIT_TEMPDB && iDb==1 ){
      sqlite3OpenTempDatabase(pToplevel);
    }
  }
}